

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O3

int32_t icu_63::number::impl::NumberFormatterImpl::writeFractionDigits
                  (MicroProps *micros,DecimalQuantity *quantity,NumberStringBuilder *string,
                  int32_t index,UErrorCode *status)

{
  DecimalFormatSymbols *pDVar1;
  int iVar2;
  int8_t iVar3;
  int32_t iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int magnitude;
  UnicodeString *unistr;
  
  iVar4 = DecimalQuantity::getLowerDisplayMagnitude(quantity);
  iVar5 = 0;
  if (iVar4 < 0) {
    iVar2 = -iVar4;
    if (-iVar4 < 2) {
      iVar2 = 1;
    }
    iVar5 = 0;
    magnitude = -1;
    do {
      iVar3 = DecimalQuantity::getDigit(quantity,magnitude);
      pDVar1 = micros->symbols;
      uVar6 = (uint)iVar3;
      if (pDVar1->fCodePointZero == -1) {
        unistr = (UnicodeString *)(&pDVar1->field_0x448 + (ulong)uVar6 * 0x40);
        if (uVar6 - 10 < 0xfffffff7) {
          unistr = (UnicodeString *)&pDVar1->field_0x108;
        }
        iVar7 = NumberStringBuilder::insert(string,iVar5 + index,unistr,UNUM_FRACTION_FIELD,status);
      }
      else {
        iVar7 = NumberStringBuilder::insertCodePoint
                          (string,iVar5 + index,pDVar1->fCodePointZero + uVar6,UNUM_FRACTION_FIELD,
                           status);
      }
      iVar5 = iVar7 + iVar5;
      iVar7 = magnitude + iVar2;
      magnitude = magnitude + -1;
    } while (iVar7 != 0);
  }
  return iVar5;
}

Assistant:

int32_t NumberFormatterImpl::writeFractionDigits(const MicroProps& micros, DecimalQuantity& quantity,
                                                 NumberStringBuilder& string, int32_t index,
                                                 UErrorCode& status) {
    int length = 0;
    int fractionCount = -quantity.getLowerDisplayMagnitude();
    for (int i = 0; i < fractionCount; i++) {
        // Get and append the next digit value
        int8_t nextDigit = quantity.getDigit(-i - 1);
        length += utils::insertDigitFromSymbols(
                string, length + index, nextDigit, *micros.symbols, UNUM_FRACTION_FIELD, status);
    }
    return length;
}